

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndValue_Test::testBody
          (TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  uint local_14;
  TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndValue_Test *pTStack_10;
  uint value;
  TEST_MockParameterTest_expectOneUnsignedIntegerParameterAndValue_Test *this_local;
  
  local_14 = 0x3840;
  pTStack_10 = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_48);
  SimpleString::SimpleString(&local_58,"parameter");
  MockExpectedCall::withParameter
            ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_58,local_14);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_68,"");
  pMVar2 = mock(&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_78);
  SimpleString::SimpleString(&local_88,"parameter");
  MockActualCall::withParameter
            ((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_88,local_14);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_98);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneUnsignedIntegerParameterAndValue)
{
    unsigned int value = 14400;
    mock().expectOneCall("foo").withParameter("parameter", value);
    mock().actualCall("foo").withParameter("parameter", value);

    mock().checkExpectations();
}